

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall
wallet::CreateWallet
          (wallet *this,WalletContext *context,string *name,optional<bool> load_on_start,
          DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  ArgsManager *this_00;
  size_type sVar8;
  Chain *pCVar9;
  string original;
  string original_00;
  string original_01;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  ArgsManager **ppAVar13;
  _Optional_payload_base<wallet::DatabaseFormat> _Var14;
  _Rb_tree_node_base *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  _Base_ptr *pp_Var17;
  __atomic_base<long> *p_Var18;
  ulong wallet_creation_flags;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar19;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *pvVar20;
  WalletContext *pWVar21;
  long *local_330;
  undefined1 local_328 [24];
  long *local_310;
  unique_lock<std::recursive_mutex> local_308;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_2f8;
  long local_2e8 [2];
  __atomic_base<long> *local_2d8 [2];
  __atomic_base<long> local_2c8 [2];
  __atomic_base<long> *local_2b8 [2];
  __atomic_base<long> local_2a8 [2];
  size_t *local_298;
  long local_290;
  size_t local_288 [2];
  __atomic_base<unsigned_long> local_278;
  Chain *local_270;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [32];
  _Base_ptr local_1d8;
  _Base_ptr local_1d0;
  _Base_ptr local_1c8 [2];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [16];
  _Rb_tree_node_base *local_1a0;
  _Base_ptr local_198;
  size_type local_190;
  undefined1 local_188 [16];
  _Base_ptr local_178;
  _Base_ptr local_170;
  __node_base local_168;
  undefined1 local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  _Base_ptr *local_d8;
  __buckets_ptr local_d0;
  _Base_ptr local_c8 [2];
  _Base_ptr *local_b8;
  long local_b0;
  _Base_ptr local_a8 [2];
  _Base_ptr *local_98;
  long local_90;
  _Base_ptr local_88 [2];
  bilingual_str local_78;
  size_t local_38;
  
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  uVar7 = options->create_flags;
  ppAVar13 = inline_assertion_check<true,ArgsManager*&>
                       (&context->args,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x184,"CreateWallet","context.args");
  if ((uVar7 >> 0x22 & 1) == 0) {
    this_00 = *ppAVar13;
    paVar2 = &local_78.original.field_2;
    local_78.original._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-swapbdbendian","");
    bVar11 = ArgsManager::GetBoolArg(this_00,&local_78.original,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar11) {
      _Var14._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x3;
      _Var14._M_engaged = true;
      _Var14._5_3_ = 0;
      goto LAB_0050fd26;
    }
  }
  else {
    _Var14._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
    _Var14._M_engaged = true;
    _Var14._5_3_ = 0;
LAB_0050fd26:
    (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::DatabaseFormat> = _Var14;
  }
  sVar8 = (options->create_passphrase)._M_string_length;
  wallet_creation_flags = uVar7 | 0x200000000;
  if (sVar8 == 0) {
    wallet_creation_flags = uVar7;
  }
  if ((wallet_creation_flags & 0x900000000) == 0x800000000) {
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Private keys must be disabled when using an external signer","")
    ;
    local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98,(long)local_98 + local_90);
    paVar2 = &local_78.translated.field_2;
    local_78.translated._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78.translated,local_98,(long)local_98 + local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_78.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78.translated);
    _Var16._M_pi = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_06;
    }
    pp_Var17 = local_98;
    if (local_98 != local_88) {
LAB_005104dd:
      operator_delete(pp_Var17,(ulong)((long)&local_88[0]->_M_color + 1));
      _Var16._M_pi = extraout_RDX_13;
    }
  }
  else if ((wallet_creation_flags & 0xc00000000) == 0x800000000) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "Descriptor support must be enabled when using an external signer","");
    local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8,(long)local_b8 + local_b0);
    paVar2 = &local_78.translated.field_2;
    local_78.translated._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78.translated,local_b8,(long)local_b8 + local_b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_78.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78.translated);
    _Var16._M_pi = extraout_RDX_07;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_09;
    }
    local_88[0] = local_a8[0];
    pp_Var17 = local_b8;
    if (local_b8 != local_a8) goto LAB_005104dd;
  }
  else {
    if (sVar8 == 0 || (wallet_creation_flags & 0x100000000) == 0) {
      MakeWalletDatabase((wallet *)&local_310,name,options,status,error);
      if (local_310 == (long *)0x0) {
        local_178 = (_Base_ptr)&local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"Wallet file verification failed.","");
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_158 + 0x10);
        local_158._0_8_ = paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_158,local_178,
                   (long)&local_178->_M_color + (long)&local_170->_M_color);
        paVar3 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_178,
                   (long)&local_178->_M_color + (long)&local_170->_M_color);
        local_1d8 = (_Base_ptr)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8," ","");
        local_1b8 = (undefined1  [8])(local_1b0 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,local_1d8,
                   (long)&local_1d8->_M_color + (long)&local_1d0->_M_color);
        local_198 = (_Base_ptr)local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_1d8,
                   (long)&local_1d8->_M_color + (long)&local_1d0->_M_color);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (char *)local_1b8,local_1b0._0_8_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_138,(char *)local_198,local_190);
        paVar4 = &local_118.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar2) {
          local_118.field_2._8_8_ = local_158._24_8_;
          local_118._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_118._M_dataplus._M_p = (pointer)local_158._0_8_;
        }
        local_118.field_2._M_allocated_capacity._1_7_ = local_158._17_7_;
        local_118.field_2._M_local_buf[0] = local_158[0x10];
        local_f8._0_8_ = local_f8 + 0x10;
        local_118._M_string_length = local_158._8_8_;
        local_158._8_8_ = (_Base_ptr)0x0;
        local_158[0x10] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == paVar3) {
          local_f8._24_8_ = local_138.field_2._8_8_;
        }
        else {
          local_f8._0_8_ = local_138._M_dataplus._M_p;
        }
        local_f8._17_7_ = local_138.field_2._M_allocated_capacity._1_7_;
        local_f8[0x10] = local_138.field_2._M_local_buf[0];
        local_f8._8_8_ = local_138._M_string_length;
        local_138._M_string_length = 0;
        local_138.field_2._M_local_buf[0] = '\0';
        local_158._0_8_ = paVar2;
        local_138._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_118,(error->original)._M_dataplus._M_p,(error->original)._M_string_length)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (error->translated)._M_dataplus._M_p,(error->translated)._M_string_length);
        paVar2 = &local_78.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar4) {
          local_78.original.field_2._8_8_ = local_118.field_2._8_8_;
          local_78.original._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_78.original._M_dataplus._M_p = local_118._M_dataplus._M_p;
        }
        local_78.original.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
        local_78.original._M_string_length = local_118._M_string_length;
        local_118._M_string_length = 0;
        local_118.field_2._M_allocated_capacity =
             local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
        paVar5 = &local_78.translated.field_2;
        if ((_Base_ptr)local_f8._0_8_ == (_Base_ptr)(local_f8 + 0x10)) {
          local_78.translated.field_2._8_8_ = local_f8._24_8_;
          local_78.translated._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_78.translated._M_dataplus._M_p = (pointer)local_f8._0_8_;
        }
        local_78.translated.field_2._M_allocated_capacity = local_f8._16_8_;
        local_78.translated._M_string_length = local_f8._8_8_;
        local_f8._8_8_ = 0;
        local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
        local_118._M_dataplus._M_p = (pointer)paVar4;
        local_f8._0_8_ = (_Base_ptr)(local_f8 + 0x10);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,&local_78.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_78.translated);
        _Var16._M_pi = extraout_RDX_14;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.translated._M_dataplus._M_p != paVar5) {
          operator_delete(local_78.translated._M_dataplus._M_p,
                          local_78.translated.field_2._M_allocated_capacity + 1);
          _Var16._M_pi = extraout_RDX_15;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.original._M_dataplus._M_p != paVar2) {
          operator_delete(local_78.original._M_dataplus._M_p,
                          local_78.original.field_2._M_allocated_capacity + 1);
          _Var16._M_pi = extraout_RDX_16;
        }
        if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          _Var16._M_pi = extraout_RDX_17;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
          _Var16._M_pi = extraout_RDX_18;
        }
        if (local_198 != (_Base_ptr)local_188) {
          operator_delete(local_198,local_188._0_8_ + 1);
          _Var16._M_pi = extraout_RDX_19;
        }
        if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
          operator_delete((void *)local_1b8,(ulong)((long)(_Rb_tree_color *)local_1b0._8_8_ + 1));
          _Var16._M_pi = extraout_RDX_20;
        }
        if (local_1d8 != (_Base_ptr)local_1c8) {
          operator_delete(local_1d8,(ulong)((long)&local_1c8[0]->_M_color + 1));
          _Var16._M_pi = extraout_RDX_21;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar3) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
          _Var16._M_pi = extraout_RDX_22;
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
          _Var16._M_pi = extraout_RDX_23;
        }
        if (local_178 != (_Base_ptr)&local_168) {
          operator_delete(local_178,(ulong)((long)&(local_168._M_nxt)->_M_nxt + 1));
          _Var16._M_pi = extraout_RDX_24;
        }
        *status = FAILED_VERIFY;
        (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
        (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
      }
      else {
        pCVar9 = context->chain;
        local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,anon_var_dwarf_1971f13,anon_var_dwarf_1971f13 + 0x11);
        psVar1 = &local_78.translated;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)psVar1,anon_var_dwarf_1971f13,anon_var_dwarf_1971f13 + 0x11);
        }
        else {
          local_1b8 = (undefined1  [8])anon_var_dwarf_1971f13;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (psVar1,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1b8);
        }
        (*pCVar9->_vptr_Chain[0x25])(pCVar9,psVar1);
        paVar2 = &local_78.translated.field_2;
        pWVar21 = context;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.translated._M_dataplus._M_p != paVar2) {
          operator_delete(local_78.translated._M_dataplus._M_p,
                          local_78.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
          operator_delete(local_78.original._M_dataplus._M_p,
                          local_78.original.field_2._M_allocated_capacity + 1);
        }
        local_330 = local_310;
        local_310 = (long *)0x0;
        pvVar20 = warnings;
        CWallet::Create((CWallet *)local_328,context,name,
                        (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         )&local_330,wallet_creation_flags,error,warnings);
        if (local_330 != (long *)0x0) {
          (**(code **)(*local_330 + 8))();
        }
        local_330 = (long *)0x0;
        if ((CWallet *)local_328._0_8_ == (CWallet *)0x0) {
          local_278._M_i = (__int_type_conflict1)&local_268;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"Wallet creation failed.","");
          local_258._M_allocated_capacity = (size_type)&local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_278._M_i,
                     (long)&local_270->_vptr_Chain + local_278._M_i);
          local_238._0_8_ = local_238 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_238,local_278._M_i,
                     (long)&local_270->_vptr_Chain + local_278._M_i);
          local_298 = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298," ","");
          local_1b8 = (undefined1  [8])(local_1b0 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,local_298,local_290 + (long)local_298);
          local_198 = (_Base_ptr)local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_298,local_290 + (long)local_298);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258
                     ,(char *)local_1b8,local_1b0._0_8_);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     (char *)local_198,local_190);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_allocated_capacity == &local_248) {
            local_218.field_2._8_8_ = local_248._8_8_;
          }
          else {
            local_218._M_dataplus._M_p = (pointer)local_258._M_allocated_capacity;
          }
          local_218.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
          local_218.field_2._M_local_buf[0] = local_248._M_local_buf[0];
          p_Var6 = (_Base_ptr)(local_1f8 + 0x10);
          local_218._M_string_length = local_258._8_8_;
          local_258._8_8_ = 0;
          local_248._M_local_buf[0] = '\0';
          if ((_Base_ptr)local_238._0_8_ == (_Base_ptr)(local_238 + 0x10)) {
            local_1f8._24_8_ = local_238._24_8_;
            local_1f8._0_8_ = p_Var6;
          }
          else {
            local_1f8._0_8_ = local_238._0_8_;
          }
          local_1f8._17_7_ = local_238._17_7_;
          local_1f8[0x10] = local_238[0x10];
          local_1f8._8_8_ = local_238._8_8_;
          local_238._8_8_ = (_Base_ptr)0x0;
          local_238[0x10] = '\0';
          local_258._M_allocated_capacity = (size_type)&local_248;
          local_238._0_8_ = (_Base_ptr)(local_238 + 0x10);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_218,(error->original)._M_dataplus._M_p,
                     (error->original)._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     (error->translated)._M_dataplus._M_p,(error->translated)._M_string_length);
          local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p == &local_218.field_2) {
            local_78.original.field_2._8_8_ = local_218.field_2._8_8_;
          }
          else {
            local_78.original._M_dataplus._M_p = local_218._M_dataplus._M_p;
          }
          local_78.original.field_2._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
          local_78.original._M_string_length = local_218._M_string_length;
          local_218._M_string_length = 0;
          local_218.field_2._M_allocated_capacity =
               local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if ((_Base_ptr)local_1f8._0_8_ == p_Var6) {
            local_78.translated.field_2._8_8_ = local_1f8._24_8_;
            local_78.translated._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_78.translated._M_dataplus._M_p = (pointer)local_1f8._0_8_;
          }
          local_78.translated.field_2._M_allocated_capacity = local_1f8._16_8_;
          local_78.translated._M_string_length = local_1f8._8_8_;
          local_1f8._8_8_ = 0;
          local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          local_1f8._0_8_ = p_Var6;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,&local_78.original);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,&local_78.translated);
          _Var16._M_pi = extraout_RDX_25;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.translated._M_dataplus._M_p != paVar2) {
            operator_delete(local_78.translated._M_dataplus._M_p,
                            local_78.translated.field_2._M_allocated_capacity + 1);
            _Var16._M_pi = extraout_RDX_26;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
            operator_delete(local_78.original._M_dataplus._M_p,
                            local_78.original.field_2._M_allocated_capacity + 1);
            _Var16._M_pi = extraout_RDX_27;
          }
          if ((_Base_ptr)local_1f8._0_8_ != p_Var6) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            _Var16._M_pi = extraout_RDX_28;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
            _Var16._M_pi = extraout_RDX_29;
          }
          if (local_198 != (_Base_ptr)local_188) {
            operator_delete(local_198,local_188._0_8_ + 1);
            _Var16._M_pi = extraout_RDX_30;
          }
          if (local_1b8 != (undefined1  [8])(local_1b0 + 8)) {
            operator_delete((void *)local_1b8,(ulong)((long)(_Rb_tree_color *)local_1b0._8_8_ + 1));
            _Var16._M_pi = extraout_RDX_31;
          }
          if (local_298 != local_288) {
            operator_delete(local_298,local_288[0] + 1);
            _Var16._M_pi = extraout_RDX_32;
          }
          if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
            _Var16._M_pi = extraout_RDX_33;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_allocated_capacity != &local_248) {
            operator_delete((void *)local_258._M_allocated_capacity,
                            CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]
                                    ) + 1);
            _Var16._M_pi = extraout_RDX_34;
          }
          if ((_Alloc_hider *)local_278._M_i != &local_268) {
            operator_delete((void *)local_278._M_i,(ulong)(local_268._M_p + 1));
            _Var16._M_pi = extraout_RDX_35;
          }
          *status = FAILED_CREATE;
LAB_00510fae:
          (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
          (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
        }
        else {
          if (((wallet_creation_flags & 0x100000000) == 0) &&
             ((options->create_passphrase)._M_string_length != 0)) {
            bVar11 = CWallet::EncryptWallet((CWallet *)local_328._0_8_,&options->create_passphrase);
            if (!bVar11) {
              local_2b8[0] = local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"Error: Wallet created but failed to encrypt.","");
              original_00._M_string_length = (size_type)this;
              original_00._M_dataplus._M_p = (pointer)pvVar20;
              original_00.field_2._M_allocated_capacity = (size_type)status;
              original_00.field_2._8_8_ = pWVar21;
              Untranslated(&local_78,original_00);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->original,&local_78.original);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->translated,&local_78.translated);
              bilingual_str::~bilingual_str(&local_78);
              _Var16._M_pi = extraout_RDX_36;
              p_Var18 = local_2b8[0];
              if (local_2b8[0] != local_2a8) {
LAB_00510f9e:
                operator_delete(p_Var18,local_2a8[0]._M_i + 1);
                _Var16._M_pi = extraout_RDX_38;
              }
LAB_00510fa6:
              *status = FAILED_ENCRYPT;
              goto LAB_00510fae;
            }
            if ((uVar7 & 0x200000000) == 0) {
              bVar11 = CWallet::Unlock((CWallet *)local_328._0_8_,&options->create_passphrase);
              if (!bVar11) {
                local_2d8[0] = local_2c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2d8,
                           "Error: Wallet was encrypted but could not be unlocked","");
                original_01._M_string_length = (size_type)this;
                original_01._M_dataplus._M_p = (pointer)pvVar20;
                original_01.field_2._M_allocated_capacity = (size_type)status;
                original_01.field_2._8_8_ = pWVar21;
                Untranslated(&local_78,original_01);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&error->original,&local_78.original);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&error->translated,&local_78.translated);
                bilingual_str::~bilingual_str(&local_78);
                _Var16._M_pi = extraout_RDX_37;
                local_2a8[0]._M_i = local_2c8[0]._M_i;
                p_Var18 = local_2d8[0];
                if (local_2d8[0] != local_2c8) goto LAB_00510f9e;
                goto LAB_00510fa6;
              }
              local_308._M_device = (mutex_type *)(local_328._0_8_ + 0x1e8);
              local_308._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&local_308);
              if (((((atomic<unsigned_long> *)(local_328._0_8_ + 0xb0))->
                   super___atomic_base<unsigned_long>)._M_i & 0x400000000) == 0) {
                CWallet::GetActiveScriptPubKeyMans
                          ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                            *)local_1b8,(CWallet *)local_328._0_8_);
                context = pWVar21;
                if (local_1a0 != (_Rb_tree_node_base *)local_1b0) {
                  p_Var15 = local_1a0;
                  do {
                    cVar12 = (**(code **)(**(long **)(p_Var15 + 1) + 0x58))
                                       (*(long **)(p_Var15 + 1),0);
                    if (cVar12 == '\0') {
                      local_2f8._M_i.__d.__r =
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            )local_2e8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_2f8,"Unable to generate initial keys","");
                      original._M_string_length = (size_type)this;
                      original._M_dataplus._M_p = (pointer)pvVar20;
                      original.field_2._M_allocated_capacity = (size_type)status;
                      original.field_2._8_8_ = pWVar21;
                      Untranslated(&local_78,original);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (&error->original,&local_78.original);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (&error->translated,&local_78.translated);
                      bilingual_str::~bilingual_str(&local_78);
                      if (local_2f8._M_i.__d.__r !=
                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           )local_2e8) {
                        operator_delete((void *)local_2f8._M_i.__d.__r,local_2e8[0] + 1);
                      }
                      *status = FAILED_CREATE;
                      (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
                           (_func_int **)0x0;
                      (((element_type *)this)->super_Notifications)._vptr_Notifications =
                           (_func_int **)0x0;
                      std::
                      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                                   *)local_1b8);
                      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_308);
                      _Var16._M_pi = extraout_RDX;
                      goto LAB_0051018e;
                    }
                    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                    context = pWVar21;
                  } while (p_Var15 != (_Rb_tree_node_base *)local_1b0);
                }
                std::
                _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                             *)local_1b8);
              }
              else {
                CWallet::SetupDescriptorScriptPubKeyMans((CWallet *)local_328._0_8_);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_308);
              CWallet::Lock((CWallet *)local_328._0_8_);
            }
          }
          NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)local_328);
          AddWallet(context,(shared_ptr<wallet::CWallet> *)local_328);
          CWallet::postInitProcess((CWallet *)local_328._0_8_);
          UpdateWalletSetting(context->chain,name,load_on_start,warnings);
          _Var16._M_pi = extraout_RDX_00;
          if ((wallet_creation_flags & 0x400000000) == 0) {
            _(&local_78,(ConstevalStringLiteral)0x841f4a);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,&local_78);
            bilingual_str::~bilingual_str(&local_78);
            _Var16._M_pi = extraout_RDX_01;
          }
          uVar10 = local_328._8_8_;
          *status = SUCCESS;
          (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
          local_328._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
               (_func_int **)local_328._0_8_;
          (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)uVar10;
          local_328._0_8_ = (CWallet *)0x0;
        }
LAB_0051018e:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
          _Var16._M_pi = extraout_RDX_02;
        }
      }
      if (local_310 != (long *)0x0) {
        (**(code **)(*local_310 + 8))();
        _Var16._M_pi = extraout_RDX_03;
      }
      goto LAB_005104f4;
    }
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "Passphrase provided but private keys are disabled. A passphrase is only used to encrypt private keys, so cannot be used for wallets with private keys disabled."
               ,"");
    local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_d8,(long)local_d8 + (long)local_d0);
    paVar2 = &local_78.translated.field_2;
    local_78.translated._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78.translated,local_d8,(long)local_d8 + (long)local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_78.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78.translated);
    _Var16._M_pi = extraout_RDX_10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_12;
    }
    local_88[0] = local_c8[0];
    pp_Var17 = local_d8;
    if (local_d8 != local_c8) goto LAB_005104dd;
  }
  *status = FAILED_CREATE;
  (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
  (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
LAB_005104f4:
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar19.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var16._M_pi;
    sVar19.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar19.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> CreateWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    uint64_t wallet_creation_flags = options.create_flags;
    const SecureString& passphrase = options.create_passphrase;

    ArgsManager& args = *Assert(context.args);

    if (wallet_creation_flags & WALLET_FLAG_DESCRIPTORS) options.require_format = DatabaseFormat::SQLITE;
    else if (args.GetBoolArg("-swapbdbendian", false)) {
        options.require_format = DatabaseFormat::BERKELEY_SWAP;
    }

    // Indicate that the wallet is actually supposed to be blank and not just blank to make it encrypted
    bool create_blank = (wallet_creation_flags & WALLET_FLAG_BLANK_WALLET);

    // Born encrypted wallets need to be created blank first.
    if (!passphrase.empty()) {
        wallet_creation_flags |= WALLET_FLAG_BLANK_WALLET;
    }

    // Private keys must be disabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Private keys must be disabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Descriptor support must be enabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        error = Untranslated("Descriptor support must be enabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Do not allow a passphrase when private keys are disabled
    if (!passphrase.empty() && (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Passphrase provided but private keys are disabled. A passphrase is only used to encrypt private keys, so cannot be used for wallets with private keys disabled.");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Wallet::Verify will check if we're trying to create a wallet with a duplicate name.
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
    if (!database) {
        error = Untranslated("Wallet file verification failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_VERIFY;
        return nullptr;
    }

    // Make the wallet
    context.chain->initMessage(_("Loading wallet…").translated);
    std::shared_ptr<CWallet> wallet = CWallet::Create(context, name, std::move(database), wallet_creation_flags, error, warnings);
    if (!wallet) {
        error = Untranslated("Wallet creation failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Encrypt the wallet
    if (!passphrase.empty() && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        if (!wallet->EncryptWallet(passphrase)) {
            error = Untranslated("Error: Wallet created but failed to encrypt.");
            status = DatabaseStatus::FAILED_ENCRYPT;
            return nullptr;
        }
        if (!create_blank) {
            // Unlock the wallet
            if (!wallet->Unlock(passphrase)) {
                error = Untranslated("Error: Wallet was encrypted but could not be unlocked");
                status = DatabaseStatus::FAILED_ENCRYPT;
                return nullptr;
            }

            // Set a seed for the wallet
            {
                LOCK(wallet->cs_wallet);
                if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                    wallet->SetupDescriptorScriptPubKeyMans();
                } else {
                    for (auto spk_man : wallet->GetActiveScriptPubKeyMans()) {
                        if (!spk_man->SetupGeneration()) {
                            error = Untranslated("Unable to generate initial keys");
                            status = DatabaseStatus::FAILED_CREATE;
                            return nullptr;
                        }
                    }
                }
            }

            // Relock the wallet
            wallet->Lock();
        }
    }

    NotifyWalletLoaded(context, wallet);
    AddWallet(context, wallet);
    wallet->postInitProcess();

    // Write the wallet settings
    UpdateWalletSetting(*context.chain, name, load_on_start, warnings);

    // Legacy wallets are being deprecated, warn if a newly created wallet is legacy
    if (!(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        warnings.push_back(_("Wallet created successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future."));
    }

    status = DatabaseStatus::SUCCESS;
    return wallet;
}